

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMinUp
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *dispatcher,
          bool updateOverlaps)

{
  int *piVar1;
  undefined1 auVar2 [16];
  btOverlappingPairCallback *pbVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  Handle *handle1;
  Handle *pHVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  Handle *pHVar12;
  long lVar13;
  undefined1 auVar14 [16];
  
  lVar10 = (long)axis;
  uVar4 = this->m_pEdges[lVar10][(ulong)edge + 1].m_handle;
  if (uVar4 != 0) {
    uVar9 = 1 << ((byte)axis & 0x1f) & 3;
    puVar6 = &this->m_pEdges[lVar10][edge].m_handle;
    uVar8 = 1 << (sbyte)uVar9 & 3;
    piVar11 = (int *)((long)(&this->m_pHandles[*puVar6].super_btBroadphaseProxy.m_aabbMax + 1) +
                     lVar10 * 4);
    do {
      if (((Edge *)(puVar6 + -1))->m_pos < puVar6[1]) {
        return;
      }
      pHVar7 = this->m_pHandles + uVar4;
      lVar13 = 0x3c;
      if (((((puVar6[1] & 1) != 0) && (lVar13 = 0x48, updateOverlaps)) &&
          (pHVar12 = this->m_pHandles + *puVar6,
          *(uint *)((long)(&(pHVar7->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar9 * 4))
          <= *(uint *)((long)pHVar12->m_maxEdges + (ulong)(uVar9 * 4)))) &&
         (((*(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar9 * 4)
                     ) <= *(uint *)((long)pHVar7->m_maxEdges + (ulong)(uVar9 * 4)) &&
           (uVar5 = (ulong)(uVar8 * 4),
           *(uint *)((long)(&(pHVar7->super_btBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
           *(uint *)((long)pHVar12->m_maxEdges + uVar5))) &&
          (uVar5 = (ulong)(uVar8 * 4),
          *(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
          *(uint *)((long)pHVar7->m_maxEdges + uVar5))))) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,pHVar12,pHVar7,dispatcher);
        pbVar3 = this->m_userPairCallback;
        if (pbVar3 != (btOverlappingPairCallback *)0x0) {
          (*pbVar3->_vptr_btOverlappingPairCallback[3])(pbVar3,pHVar12,pHVar7,dispatcher);
        }
      }
      piVar1 = (int *)((long)(pHVar7->super_btBroadphaseProxy).m_aabbMin.m_floats +
                      lVar10 * 4 + lVar13 + -0x1c);
      *piVar1 = *piVar1 + -1;
      *piVar11 = *piVar11 + 1;
      auVar2 = *(undefined1 (*) [16])(puVar6 + -1);
      auVar14._0_8_ = auVar2._8_8_;
      auVar14._8_4_ = auVar2._0_4_;
      auVar14._12_4_ = auVar2._4_4_;
      *(undefined1 (*) [16])(puVar6 + -1) = auVar14;
      uVar4 = puVar6[4];
      puVar6 = puVar6 + 2;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			
			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps 
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				

				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);	
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
				
			}


			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}